

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void indexedX0p_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  m680x_info *unaff_retaddr;
  
  add_indexed_operand(unaff_retaddr,(m680x_reg)((ulong)in_RDI >> 0x20),
                      SUB81((ulong)in_RDI >> 0x18,0),(uint8_t)((ulong)in_RDI >> 0x10),
                      (uint8_t)((ulong)in_RDI >> 8),(uint16_t)((ulong)in_RSI >> 0x30),
                      SUB81((ulong)in_RSI >> 0x28,0));
  return;
}

Assistant:

static void indexedX0p_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	add_indexed_operand(info, M680X_REG_X, true, 1, M680X_OFFSET_NONE,
		0, true);
}